

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O0

int bin_mdef_free(bin_mdef_t *m)

{
  int iVar1;
  bin_mdef_t *m_local;
  
  if (m == (bin_mdef_t *)0x0) {
    m_local._4_4_ = 0;
  }
  else {
    iVar1 = m->refcnt + -1;
    m->refcnt = iVar1;
    if (iVar1 < 1) {
      if (m->alloc_mode == BIN_MDEF_FROM_TEXT) {
        ckd_free(*m->ciname);
        ckd_free(*m->sseq);
        ckd_free(m->phone);
        ckd_free(m->cd_tree);
      }
      else if (m->alloc_mode == BIN_MDEF_IN_MEMORY) {
        ckd_free(*m->ciname);
      }
      if (m->filemap != (mmio_file_t *)0x0) {
        mmio_file_unmap(m->filemap);
      }
      ckd_free(m->cd2cisen);
      ckd_free(m->sen2cimap);
      ckd_free(m->ciname);
      ckd_free(m->sseq);
      ckd_free(m);
      m_local._4_4_ = 0;
    }
    else {
      m_local._4_4_ = m->refcnt;
    }
  }
  return m_local._4_4_;
}

Assistant:

int
bin_mdef_free(bin_mdef_t * m)
{
    if (m == NULL)
        return 0;
    if (--m->refcnt > 0)
        return m->refcnt;

    switch (m->alloc_mode) {
    case BIN_MDEF_FROM_TEXT:
        ckd_free(m->ciname[0]);
        ckd_free(m->sseq[0]);
        ckd_free(m->phone);
        ckd_free(m->cd_tree);
        break;
    case BIN_MDEF_IN_MEMORY:
        ckd_free(m->ciname[0]);
        break;
    case BIN_MDEF_ON_DISK:
        break;
    }
    if (m->filemap)
        mmio_file_unmap(m->filemap);
    ckd_free(m->cd2cisen);
    ckd_free(m->sen2cimap);
    ckd_free(m->ciname);
    ckd_free(m->sseq);
    ckd_free(m);
    return 0;
}